

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_t sVar1;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  __s = "unknown file";
  if (this != (internal *)0x0) {
    __s = (char *)this;
  }
  if ((int)file < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,(internal *)__s + sVar1);
  }
  else {
    String::Format_abi_cxx11_(&local_38,"%s:%d",__s,(ulong)file & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,&local_39);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}